

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O2

Ssw_Cla_t *
Ssw_ClassesPrepare(Aig_Man_t *pAig,int nFramesK,int fLatchCorr,int fConstCorr,int fOutputCorr,
                  int nMaxLevs,int fVerbose)

{
  ulong uVar1;
  Ssw_Cla_t *p;
  abctime aVar2;
  Ssw_Sml_t *p_00;
  abctime aVar3;
  Vec_Ptr_t *vCands;
  int *Entry;
  void *pvVar4;
  ulong uVar5;
  Aig_Obj_t **ppAVar6;
  long lVar7;
  Aig_Obj_t *pAVar8;
  uint uVar9;
  int iVar10;
  Aig_Man_t *pAVar11;
  Vec_Ptr_t *pVVar12;
  Ssw_Cla_t *pSVar13;
  int iVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  
  uVar15 = 4;
  if (4 < nFramesK) {
    uVar15 = (ulong)(uint)nFramesK;
  }
  p = Ssw_ClassesStart(pAig);
  p->fConstCorr = fConstCorr;
  aVar2 = Abc_Clock();
  iVar14 = 0;
  pAVar11 = pAig;
  p_00 = Ssw_SmlSimulateSeq(pAig,0,(int)uVar15,2);
  iVar10 = (int)pAVar11;
  if (fVerbose != 0) {
    lVar7 = uVar15 * (long)pAig->vObjs->nSize * 8;
    auVar16._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar16._0_8_ = lVar7;
    auVar16._12_4_ = 0x45300000;
    Abc_Print(iVar10,"Allocated %.2f MB to store simulation information.\n",
              ((auVar16._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 9.5367431640625e-07)
    ;
    Abc_Print(iVar10,"Initial simulation of %d frames with %d words.     ",uVar15,2);
    Abc_Print(iVar10,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  p->pManData = p_00;
  p->pFuncNodeHash = Ssw_SmlObjHashWord;
  p->pFuncNodeIsConst = Ssw_SmlObjIsConstWord;
  p->pFuncNodesAreEqual = Ssw_SmlObjsAreEqualWord;
  vCands = Vec_PtrAlloc(1000);
  pAVar11 = p->pAig;
  while( true ) {
    pVVar12 = pAVar11->vObjs;
    iVar10 = pVVar12->nSize;
    if (iVar10 <= iVar14) break;
    Entry = (int *)Vec_PtrEntry(pVVar12,iVar14);
    if (Entry != (int *)0x0) {
      uVar9 = (uint)*(undefined8 *)(Entry + 6);
      if (fLatchCorr == 0) {
        uVar9 = uVar9 & 7;
        if (((uVar9 == 2) || (uVar9 - 5 < 2)) &&
           ((nMaxLevs == 0 ||
            ((int)((uint)((ulong)*(undefined8 *)(Entry + 6) >> 0x20) & 0xffffff) <= nMaxLevs))))
        goto LAB_004e1a5b;
      }
      else if (((uVar9 & 7) == 2) && (pAVar11->nTruePis <= *Entry)) {
LAB_004e1a5b:
        Vec_PtrPush(vCands,Entry);
      }
    }
    iVar14 = iVar14 + 1;
  }
  if (fOutputCorr != 0) {
    vCands->nSize = 0;
    for (iVar14 = 0; iVar14 < iVar10; iVar14 = iVar14 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar12,iVar14);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
      }
      pVVar12 = pAVar11->vObjs;
      iVar10 = pVVar12->nSize;
    }
    for (iVar10 = 0; iVar10 < pAVar11->nTruePos; iVar10 = iVar10 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar11->vCos,iVar10);
      uVar5 = *(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffe;
      uVar1 = *(ulong *)(uVar5 + 0x18);
      uVar9 = (uint)uVar1 & 7;
      if ((uVar9 < 7) && ((100U >> uVar9 & 1) != 0)) {
        *(ulong *)(uVar5 + 0x18) = uVar1 | 0x20;
      }
    }
    iVar10 = 0;
    while( true ) {
      pVVar12 = pAVar11->vObjs;
      iVar14 = pVVar12->nSize;
      if (iVar14 <= iVar10) break;
      pvVar4 = Vec_PtrEntry(pVVar12,iVar10);
      if ((pvVar4 != (void *)0x0) && ((*(byte *)((long)pvVar4 + 0x18) & 0x20) != 0)) {
        Vec_PtrPush(vCands,pvVar4);
      }
      iVar10 = iVar10 + 1;
    }
    for (iVar10 = 0; iVar10 < iVar14; iVar10 = iVar10 + 1) {
      pvVar4 = Vec_PtrEntry(pVVar12,iVar10);
      if (pvVar4 != (void *)0x0) {
        *(byte *)((long)pvVar4 + 0x18) = *(byte *)((long)pvVar4 + 0x18) & 0xdf;
      }
      pVVar12 = pAVar11->vObjs;
      iVar14 = pVVar12->nSize;
    }
  }
  ppAVar6 = (Aig_Obj_t **)malloc((long)vCands->nSize << 3);
  p->pMemClasses = ppAVar6;
  p->pMemClassesFree = ppAVar6;
  pSVar13 = p;
  Ssw_ClassesPrepareRehash(p,vCands,fConstCorr);
  iVar10 = (int)pSVar13;
  if (fVerbose != 0) {
    Abc_Print(iVar10,"Collecting candidate equivalence classes.        ");
    Abc_Print(iVar10,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(iVar10,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  aVar2 = Abc_Clock();
  for (iVar10 = 1; iVar10 != 0x10; iVar10 = iVar10 + 1) {
    vCands->nSize = 0;
    pAVar11 = p->pAig;
    for (iVar14 = 0; iVar14 < pAVar11->vObjs->nSize; iVar14 = iVar14 + 1) {
      pvVar4 = Vec_PtrEntry(pAVar11->vObjs,iVar14);
      if (pvVar4 != (void *)0x0) {
        if (pAVar11->pReprs == (Aig_Obj_t **)0x0) {
          pAVar8 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar8 = pAVar11->pReprs[*(int *)((long)pvVar4 + 0x24)];
        }
        if (pAVar8 == pAVar11->pConst1) {
          Vec_PtrPush(vCands,pvVar4);
        }
      }
    }
    if (vCands->nSize != p->nCands1) {
      __assert_fail("Vec_PtrSize(vCands) == p->nCands1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswClass.c"
                    ,0x2b4,
                    "Ssw_Cla_t *Ssw_ClassesPrepare(Aig_Man_t *, int, int, int, int, int, int)");
    }
    Ssw_SmlResimulateSeq(p_00);
    iVar14 = Ssw_ClassesPrepareRehash(p,vCands,fConstCorr);
    if (iVar14 == 0) break;
  }
  Ssw_SmlStop(p_00);
  Vec_PtrFree(vCands);
  iVar14 = (int)vCands;
  if (fVerbose != 0) {
    Abc_Print(iVar14,"Simulation of %d frames with %d words (%2d rounds). ",uVar15,2,
              (ulong)(iVar10 - 1));
    Abc_Print(iVar14,"%s =","Time");
    aVar3 = Abc_Clock();
    Abc_Print(iVar14,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  }
  Ssw_ClassesCheck(p);
  return p;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesPrepare( Aig_Man_t * pAig, int nFramesK, int fLatchCorr, int fConstCorr, int fOutputCorr, int nMaxLevs, int fVerbose )
{
//    int nFrames =  4;
//    int nWords  =  1;
//    int nIters  = 16;

//    int nFrames = 32;
//    int nWords  =  4;
//    int nIters  =  0;

    int nFrames =  Abc_MaxInt( nFramesK, 4 );
    int nWords  =  2;
    int nIters  = 16;
    Ssw_Cla_t * p;
    Ssw_Sml_t * pSml;
    Vec_Ptr_t * vCands;
    Aig_Obj_t * pObj;
    int i, k, RetValue;
    abctime clk;

    // start the classes
    p = Ssw_ClassesStart( pAig );
    p->fConstCorr = fConstCorr;

    // perform sequential simulation
clk = Abc_Clock();
    pSml = Ssw_SmlSimulateSeq( pAig, 0, nFrames, nWords );
if ( fVerbose )
{
    Abc_Print( 1, "Allocated %.2f MB to store simulation information.\n",
        1.0*(sizeof(unsigned) * Aig_ManObjNumMax(pAig) * nFrames * nWords)/(1<<20) );
    Abc_Print( 1, "Initial simulation of %d frames with %d words.     ", nFrames, nWords );
    ABC_PRT( "Time", Abc_Clock() - clk );
}

    // set comparison procedures
clk = Abc_Clock();
    Ssw_ClassesSetData( p, pSml, (unsigned(*)(void *,Aig_Obj_t *))Ssw_SmlObjHashWord, (int(*)(void *,Aig_Obj_t *))Ssw_SmlObjIsConstWord, (int(*)(void *,Aig_Obj_t *,Aig_Obj_t *))Ssw_SmlObjsAreEqualWord );

    // collect nodes to be considered as candidates
    vCands = Vec_PtrAlloc( 1000 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Saig_ObjIsLo(p->pAig, pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        Vec_PtrPush( vCands, pObj );
    }

    // this change will consider all PO drivers
    if ( fOutputCorr )
    {
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
        Saig_ManForEachPo( p->pAig, pObj, i )
            if ( Aig_ObjIsCand(Aig_ObjFanin0(pObj)) )
                Aig_ObjFanin0(pObj)->fMarkB = 1;
        Aig_ManForEachObj( p->pAig, pObj, i )
            if ( pObj->fMarkB )
                Vec_PtrPush( vCands, pObj );
        Aig_ManForEachObj( p->pAig, pObj, i )
            pObj->fMarkB = 0;
    }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, Vec_PtrSize(vCands) );
    p->pMemClassesFree = p->pMemClasses;

    // now it is time to refine the classes
    Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
if ( fVerbose )
{
    Abc_Print( 1, "Collecting candidate equivalence classes.        " );
ABC_PRT( "Time", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // perform iterative refinement using simulation
    for ( i = 1; i < nIters; i++ )
    {
        // collect const1 candidates
        Vec_PtrClear( vCands );
        Aig_ManForEachObj( p->pAig, pObj, k )
            if ( Ssw_ObjIsConst1Cand( p->pAig, pObj ) )
                Vec_PtrPush( vCands, pObj );
        assert( Vec_PtrSize(vCands) == p->nCands1 );
        // perform new round of simulation
        Ssw_SmlResimulateSeq( pSml );
        // check equivalence classes
        RetValue = Ssw_ClassesPrepareRehash( p, vCands, fConstCorr );
        if ( RetValue == 0 )
            break;
    }
    Ssw_SmlStop( pSml );
    Vec_PtrFree( vCands );
if ( fVerbose )
{
    Abc_Print( 1, "Simulation of %d frames with %d words (%2d rounds). ",
        nFrames, nWords, i-1 );
    ABC_PRT( "Time", Abc_Clock() - clk );
}
    Ssw_ClassesCheck( p );
//    Ssw_ClassesPrint( p, 0 );
    return p;
}